

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O1

IterateResult __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::iterate(InputVariablesCannotBeModifiedTest *this)

{
  ostringstream *this_00;
  _shader_stage stage;
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLuint GVar4;
  uint err;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLuint *pGVar7;
  TestError *this_01;
  char *pcVar8;
  InputVariablesCannotBeModifiedTest *pIVar9;
  _test_iteration iteration;
  ApiType current_iteration_min_context_type;
  GLint compile_status;
  _shader_stage current_iteration_shader_stage;
  string current_iteration_body;
  char *current_iteration_body_raw_ptr;
  char temp [1024];
  ApiType local_654;
  int local_650;
  _shader_stage local_64c;
  undefined1 local_648 [32];
  _Alloc_hider local_628;
  string local_620;
  string local_600;
  GLuint *local_5e0;
  GLuint *local_5d8;
  GLuint *local_5d0;
  GLuint *local_5c8;
  GLuint *local_5c0;
  undefined1 local_5b8 [120];
  ios_base local_540 [264];
  undefined1 local_438 [1032];
  long lVar6;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x123);
  if (bVar1) {
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar4;
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar1) {
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
    this->m_tc_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
    this->m_te_id = GVar4;
  }
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  local_5c0 = &this->m_fs_id;
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  local_5c8 = &this->m_vs_id;
  this->m_vs_id = GVar4;
  err = (**(code **)(lVar6 + 0x800))();
  pIVar9 = (InputVariablesCannotBeModifiedTest *)(ulong)err;
  glu::checkError(err,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x380);
  local_5d8 = &this->m_te_id;
  local_5d0 = &this->m_tc_id;
  local_5e0 = &this->m_gs_id;
  this_00 = (ostringstream *)(local_5b8 + 8);
  bVar1 = true;
  iteration = TEST_ITERATION_FIRST;
  do {
    local_650 = 0;
    local_648._0_8_ = local_648 + 0x10;
    local_648._8_8_ = 0;
    local_648[0x10] = '\0';
    local_628._M_p = (pointer)0x0;
    local_654.m_bits = 0x300;
    getIterationData(pIVar9,iteration,&local_654,&local_64c,(string *)local_648);
    local_628._M_p = (pointer)local_648._0_8_;
    bVar2 = glu::contextSupports(ctxType,local_654);
    stage = local_64c;
    if (bVar2) {
      pGVar7 = local_5c0;
      switch(local_64c) {
      case SHADER_STAGE_FRAGMENT:
        break;
      case SHADER_STAGE_GEOMETRY:
        pGVar7 = local_5e0;
        break;
      case SHADER_STAGE_TESSELLATION_CONTROL:
        pGVar7 = local_5d0;
        break;
      case SHADER_STAGE_TESSELLATION_EVALUATION:
        pGVar7 = local_5d8;
        break;
      case SHADER_STAGE_VERTEX:
        pGVar7 = local_5c8;
        break;
      default:
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unrecognized shader stage type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                   ,0x3ad);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar4 = *pGVar7;
      (**(code **)(lVar6 + 0x12b8))(GVar4,1,&local_628,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3b6);
      (**(code **)(lVar6 + 0x248))(GVar4);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3ba);
      (**(code **)(lVar6 + 0xa70))(GVar4,0x8b81,&local_650);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3bd);
      (**(code **)(lVar6 + 0xa58))(GVar4,0x400,0,local_438);
      if (local_650 == 1) {
        local_5b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        pcVar8 = "The following ";
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"The following ",0xe);
        getShaderStageName_abi_cxx11_(&local_600,(InputVariablesCannotBeModifiedTest *)pcVar8,stage)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_600._M_dataplus._M_p,local_600._M_string_length);
        pIVar9 = (InputVariablesCannotBeModifiedTest *)0x1af6ee9;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00," shader, used for test iteration [",0x22);
        getIterationName_abi_cxx11_(&local_620,pIVar9,iteration);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,local_620._M_dataplus._M_p,local_620._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   "] was compiled successfully, even though it is invalid. Body:\n>>\n",0x41);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,(char *)local_648._0_8_,local_648._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n<<\n",4);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_620._M_dataplus._M_p != &local_620.field_2) {
          operator_delete(local_620._M_dataplus._M_p,local_620.field_2._0_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_600._M_dataplus._M_p != &local_600.field_2) {
          operator_delete(local_600._M_dataplus._M_p,local_600.field_2._0_8_ + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_540);
        bVar1 = false;
      }
    }
    pIVar9 = (InputVariablesCannotBeModifiedTest *)local_648._0_8_;
    if ((InputVariablesCannotBeModifiedTest *)local_648._0_8_ !=
        (InputVariablesCannotBeModifiedTest *)(local_648 + 0x10)) {
      operator_delete((void *)local_648._0_8_,CONCAT71(local_648._17_7_,local_648[0x10]) + 1);
    }
    iteration = iteration + TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK;
  } while (iteration != TEST_ITERATION_COUNT);
  pcVar8 = "Fail";
  if (bVar1) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1,
             pcVar8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InputVariablesCannotBeModifiedTest::iterate()
{
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= true;

	/* Create shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); current_iteration++)
	{
		glw::GLint	compile_status = GL_FALSE;
		std::string   current_iteration_body;
		const char*   current_iteration_body_raw_ptr = NULL;
		glu::ApiType  current_iteration_min_context_type;
		_shader_stage current_iteration_shader_stage;
		glw::GLuint   so_id = 0;

		getIterationData(static_cast<_test_iteration>(current_iteration), &current_iteration_min_context_type,
						 &current_iteration_shader_stage, &current_iteration_body);

		current_iteration_body_raw_ptr = current_iteration_body.c_str();

		/* Determine shader ID for the iteration. If the shader stage is not supported
		 * for the running context, skip it. */
		if (!glu::contextSupports(context_type, current_iteration_min_context_type))
		{
			continue;
		}

		switch (current_iteration_shader_stage)
		{
		case SHADER_STAGE_FRAGMENT:
			so_id = m_fs_id;
			break;
		case SHADER_STAGE_GEOMETRY:
			so_id = m_gs_id;
			break;
		case SHADER_STAGE_TESSELLATION_CONTROL:
			so_id = m_tc_id;
			break;
		case SHADER_STAGE_TESSELLATION_EVALUATION:
			so_id = m_te_id;
			break;
		case SHADER_STAGE_VERTEX:
			so_id = m_vs_id;
			break;

		default:
		{
			TCU_FAIL("Unrecognized shader stage type");
		}
		} /* switch (current_iteration_shader_stage) */

		DE_ASSERT(so_id != 0);

		/* Assign the source code to the SO */
		gl.shaderSource(so_id, 1,								   /* count */
						&current_iteration_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		char temp[1024];

		gl.getShaderInfoLog(so_id, 1024, NULL, temp);

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following "
							   << getShaderStageName(current_iteration_shader_stage)
							   << " shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << current_iteration_body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}